

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AddColumn(Parse *pParse,Token *pName)

{
  byte bVar1;
  Table *pTVar2;
  sqlite3 *db;
  byte *pbVar3;
  Column *pCVar4;
  byte *pbVar5;
  uint uVar6;
  byte *p;
  Column *p_00;
  short sVar7;
  ulong uVar8;
  uchar *b;
  ulong uVar9;
  
  pTVar2 = pParse->pNewTable;
  if (pTVar2 != (Table *)0x0) {
    db = pParse->db;
    if (db->aLimit[2] <= (int)pTVar2->nCol) {
      sqlite3ErrorMsg(pParse,"too many columns on %s",pTVar2->zName);
      return;
    }
    p = (byte *)sqlite3NameFromToken(db,pName);
    if (p != (byte *)0x0) {
      sVar7 = pTVar2->nCol;
      uVar6 = (uint)sVar7;
      if (0 < sVar7) {
        uVar8 = 0;
        do {
          pbVar3 = (byte *)pTVar2->aCol[uVar8].zName;
          if (""[*p] == ""[*pbVar3]) {
            bVar1 = p[1];
            pbVar5 = p + 2;
            while (pbVar3 = pbVar3 + 1, bVar1 != 0) {
              uVar9 = (ulong)bVar1;
              if (""[uVar9] != ""[*pbVar3]) goto LAB_00140bd4;
              bVar1 = *pbVar5;
              pbVar5 = pbVar5 + 1;
            }
            uVar9 = 0;
LAB_00140bd4:
            if (""[uVar9] == ""[*pbVar3]) {
              sqlite3ErrorMsg(pParse,"duplicate column name: %s",p);
              goto LAB_00140ca7;
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar6);
      }
      p_00 = pTVar2->aCol;
      if ((uVar6 & 7) == 0) {
        p_00 = (Column *)sqlite3DbRealloc(db,p_00,(long)(int)uVar6 * 0x30 + 0x180);
        if (p_00 == (Column *)0x0) {
LAB_00140ca7:
          sqlite3DbFree(db,p);
          return;
        }
        pTVar2->aCol = p_00;
        sVar7 = pTVar2->nCol;
      }
      p_00[sVar7].zType = (char *)0x0;
      (&p_00[sVar7].zType)[1] = (char *)0x0;
      p_00[sVar7].pDflt = (Expr *)0x0;
      (&p_00[sVar7].pDflt)[1] = (Expr *)0x0;
      pCVar4 = p_00 + sVar7;
      pCVar4->notNull = '\0';
      pCVar4->affinity = '\0';
      pCVar4->szEst = '\0';
      pCVar4->colFlags = '\0';
      *(undefined4 *)&pCVar4->field_0x2c = 0;
      p_00[sVar7].zName = (char *)p;
      p_00[sVar7].affinity = 'A';
      p_00[sVar7].szEst = '\x01';
      pTVar2->nCol = pTVar2->nCol + 1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddColumn(Parse *pParse, Token *pName){
  Table *p;
  int i;
  char *z;
  Column *pCol;
  sqlite3 *db = pParse->db;
  if( (p = pParse->pNewTable)==0 ) return;
#if SQLITE_MAX_COLUMN
  if( p->nCol+1>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns on %s", p->zName);
    return;
  }
#endif
  z = sqlite3NameFromToken(db, pName);
  if( z==0 ) return;
  for(i=0; i<p->nCol; i++){
    if( STRICMP(z, p->aCol[i].zName) ){
      sqlite3ErrorMsg(pParse, "duplicate column name: %s", z);
      sqlite3DbFree(db, z);
      return;
    }
  }
  if( (p->nCol & 0x7)==0 ){
    Column *aNew;
    aNew = sqlite3DbRealloc(db,p->aCol,(p->nCol+8)*sizeof(p->aCol[0]));
    if( aNew==0 ){
      sqlite3DbFree(db, z);
      return;
    }
    p->aCol = aNew;
  }
  pCol = &p->aCol[p->nCol];
  memset(pCol, 0, sizeof(p->aCol[0]));
  pCol->zName = z;
 
  /* If there is no type specified, columns have the default affinity
  ** 'NONE'. If there is a type specified, then sqlite3AddColumnType() will
  ** be called next to set pCol->affinity correctly.
  */
  pCol->affinity = SQLITE_AFF_NONE;
  pCol->szEst = 1;
  p->nCol++;
}